

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O0

ion_err_t ion_close_all_master_table(void)

{
  ion_err_t iVar1;
  int iVar2;
  ion_dictionary_id_t local_9c;
  undefined1 local_98 [4];
  ion_dictionary_id_t id;
  ion_dictionary_config_info_t config;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  ion_err_t err;
  
  if (ion_master_table_file != (FILE *)0x0) {
    for (local_9c = ion_master_table_next_id - 1; local_9c != 0; local_9c = local_9c - 1) {
      iVar1 = ion_lookup_in_master_table(local_9c,(ion_dictionary_config_info_t *)local_98);
      if ((iVar1 == '\0') && ((char)config.dictionary_size != '\x01')) {
        iVar1 = ion_switch_handler(config.value_size,(ion_dictionary_handler_t *)&dict.handler);
        if (iVar1 != '\0') {
          return iVar1;
        }
        dict.instance = (ion_dictionary_parent_t *)&dict.handler;
        iVar1 = dictionary_open((ion_dictionary_handler_t *)&dict.handler,
                                (ion_dictionary_t *)&config.dictionary_type,
                                (ion_dictionary_config_info_t *)local_98);
        if (iVar1 != '\0') {
          return iVar1;
        }
        iVar1 = dictionary_close((ion_dictionary_t *)&config.dictionary_type);
        if (iVar1 != '\0') {
          return iVar1;
        }
      }
    }
    iVar2 = fclose((FILE *)ion_master_table_file);
    if (iVar2 != 0) {
      return '\n';
    }
  }
  ion_master_table_file = (FILE *)0x0;
  return '\0';
}

Assistant:

ion_err_t
ion_close_all_master_table(
	void
) {
	ion_err_t						err;
	ion_dictionary_handler_t		handler;
	ion_dictionary_t				dict;
	ion_dictionary_config_info_t	config;

	ion_dictionary_id_t id = ion_master_table_next_id;

	if (NULL != ion_master_table_file) {
		id--;

		while (id > 0) {
			err = ion_lookup_in_master_table(id, &config);

			/* Dictionary corresponding to ID has been found and dictionary is open. */
			if ((err_ok == err) && (ion_dictionary_status_closed != config.dictionary_status)) {
				err = ion_switch_handler(config.dictionary_type, &handler);

				if (err_ok != err) {
					return err;
				}

				dict.handler	= &handler;

				/* Initialize dictionary instance. */
				err				= dictionary_open(&handler, &dict, &config);

				if (err_ok != err) {
					return err;
				}

				/* Close the dictionary instance. */
				err = dictionary_close(&dict);

				if (err_ok != err) {
					return err;
				}
			}

			id--;
		}

		if (0 != fclose(ion_master_table_file)) {
			return err_file_close_error;
		}
	}

	ion_master_table_file = NULL;

	return err_ok;
}